

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O0

bool __thiscall
psy::C::Parser::parseExtKR_ParameterDeclaration
          (Parser *this,ExtKR_ParameterDeclarationSyntax **paramDecl)

{
  bool bVar1;
  SyntaxKind SVar2;
  ExtKR_ParameterDeclarationSyntax *pEVar3;
  SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*> *pSVar4;
  SyntaxToken *this_00;
  IndexType IVar5;
  _func_int *p_Var6;
  DeclaratorSyntax *local_40;
  DeclaratorSyntax *decltor;
  DeclaratorListSyntax **decltorList_cur;
  SpecifierListSyntax *specList;
  DeclarationSyntax *decl;
  ExtKR_ParameterDeclarationSyntax **paramDecl_local;
  Parser *this_local;
  
  specList = (SpecifierListSyntax *)0x0;
  decltorList_cur = (DeclaratorListSyntax **)0x0;
  decl = (DeclarationSyntax *)paramDecl;
  paramDecl_local = (ExtKR_ParameterDeclarationSyntax **)this;
  bVar1 = parseDeclarationSpecifiers
                    (this,(DeclarationSyntax **)&specList,(SpecifierListSyntax **)&decltorList_cur,
                     Unspecified);
  if (bVar1) {
    pEVar3 = makeNode<psy::C::ExtKR_ParameterDeclarationSyntax>(this);
    (decl->super_SyntaxNode).super_Managed._vptr_Managed = (_func_int **)pEVar3;
    (decl->super_SyntaxNode).super_Managed._vptr_Managed[5] = (_func_int *)decltorList_cur;
    decltor = (DeclaratorSyntax *)((decl->super_SyntaxNode).super_Managed._vptr_Managed + 6);
    while( true ) {
      local_40 = (DeclaratorSyntax *)0x0;
      bVar1 = parseDeclarator(this,&local_40,Parameter);
      if (!bVar1) break;
      pSVar4 = makeNode<psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax*>,psy::C::DeclaratorSyntax*&>
                         (this,&local_40);
      (decltor->super_SyntaxNode).super_Managed._vptr_Managed = (_func_int **)pSVar4;
      this_00 = peek(this,1);
      SVar2 = SyntaxToken::kind(this_00);
      if (SVar2 == SemicolonToken) {
        p_Var6 = (_func_int *)consume(this);
        (decl->super_SyntaxNode).super_Managed._vptr_Managed[7] = p_Var6;
        return true;
      }
      if (SVar2 != CommaToken) {
        return false;
      }
      IVar5 = consume(this);
      *(int *)((decltor->super_SyntaxNode).super_Managed._vptr_Managed + 5) = (int)IVar5;
      decltor = (DeclaratorSyntax *)((decltor->super_SyntaxNode).super_Managed._vptr_Managed + 2);
    }
  }
  return false;
}

Assistant:

bool Parser::parseExtKR_ParameterDeclaration(ExtKR_ParameterDeclarationSyntax*& paramDecl)
{
    DBG_THIS_RULE();

    DeclarationSyntax* decl = nullptr;
    SpecifierListSyntax* specList = nullptr;
    if (!parseDeclarationSpecifiers(decl, specList, DeclarationContext::Unspecified))
        return false;

    paramDecl = makeNode<ExtKR_ParameterDeclarationSyntax>();
    paramDecl->specs_ = specList;

    DeclaratorListSyntax** decltorList_cur = &paramDecl->decltors_;
    while (true) {
        DeclaratorSyntax* decltor = nullptr;
        if (!parseDeclarator(decltor, DeclarationContext::Parameter))
            return false;

        *decltorList_cur = makeNode<DeclaratorListSyntax>(decltor);
        switch (peek().kind()) {
            case SyntaxKind::CommaToken:
                (*decltorList_cur)->delimTkIdx_ = consume();
                decltorList_cur = &(*decltorList_cur)->next;
                break;

            case SyntaxKind::SemicolonToken:
                paramDecl->semicolonTkIdx_ = consume();
                return true;

            default:
                return false;
        }
    }
}